

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISkin.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISkin::draw3DToolBar(CGUISkin *this,IGUIElement *element,rect<int> *r,rect<int> *clip)

{
  long *plVar1;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RDI;
  SColor c2_1;
  SColor c1_1;
  SColor c2;
  SColor c1;
  rect<int> rect;
  SColor local_44;
  uint local_40;
  SColor local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  
  if (in_RDI[0x4b] != 0) {
    local_30 = CONCAT44(*(int *)((long)in_RDX + 0xc) + -1,*(undefined4 *)in_RDX);
    local_28 = in_RDX[1];
    plVar1 = (long *)in_RDI[0x4b];
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_34 = (**(code **)*in_RDI)(in_RDI,1);
    (**(code **)(*plVar1 + 0x198))(plVar1,local_34,&local_30,local_20);
    local_30 = *local_18;
    local_28._4_4_ = (int)((ulong)local_18[1] >> 0x20);
    local_28._4_4_ = local_28._4_4_ + -1;
    local_28._0_4_ = (undefined4)local_18[1];
    if ((*(byte *)(in_RDI + 0x4c) & 1) == 0) {
      plVar1 = (long *)in_RDI[0x4b];
      local_38 = (**(code **)*in_RDI)(in_RDI,2);
      (**(code **)(*plVar1 + 0x198))(plVar1,local_38,&local_30,local_20);
    }
    else if (*(int *)((long)in_RDI + 0x264) == 2) {
      local_40 = (**(code **)*in_RDI)(in_RDI,2);
      video::SColor::SColor(&local_3c,local_40 | 0xf0000000);
      uVar2 = (**(code **)*in_RDI)(in_RDI,1);
      video::SColor::SColor(&local_44,uVar2 | 0xf0000000);
      local_28 = CONCAT44(local_28._4_4_ + 1,(undefined4)local_28);
      (**(code **)(*(long *)in_RDI[0x4b] + 0x1a0))
                ((long *)in_RDI[0x4b],&local_30,local_3c.color,local_44.color,local_3c.color,
                 local_44.color,local_20);
    }
    else {
      uVar3 = (**(code **)*in_RDI)(in_RDI,2);
      uVar4 = (**(code **)*in_RDI)(in_RDI,1);
      (**(code **)(*(long *)in_RDI[0x4b] + 0x1a0))
                ((long *)in_RDI[0x4b],&local_30,uVar3,uVar3,uVar4,uVar4,local_20);
    }
  }
  return;
}

Assistant:

void CGUISkin::draw3DToolBar(IGUIElement *element,
		const core::rect<s32> &r,
		const core::rect<s32> *clip)
{
	if (!Driver)
		return;

	core::rect<s32> rect = r;

	rect.UpperLeftCorner.X = r.UpperLeftCorner.X;
	rect.UpperLeftCorner.Y = r.LowerRightCorner.Y - 1;
	rect.LowerRightCorner.Y = r.LowerRightCorner.Y;
	rect.LowerRightCorner.X = r.LowerRightCorner.X;
	Driver->draw2DRectangle(getColor(EGDC_3D_SHADOW), rect, clip);

	rect = r;
	rect.LowerRightCorner.Y -= 1;

	if (!UseGradient) {
		Driver->draw2DRectangle(getColor(EGDC_3D_FACE), rect, clip);
	} else if (Type == EGST_BURNING_SKIN) {
		const video::SColor c1 = 0xF0000000 | getColor(EGDC_3D_FACE).color;
		const video::SColor c2 = 0xF0000000 | getColor(EGDC_3D_SHADOW).color;

		rect.LowerRightCorner.Y += 1;
		Driver->draw2DRectangle(rect, c1, c2, c1, c2, clip);
	} else {
		const video::SColor c1 = getColor(EGDC_3D_FACE);
		const video::SColor c2 = getColor(EGDC_3D_SHADOW);
		Driver->draw2DRectangle(rect, c1, c1, c2, c2, clip);
	}
}